

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  bool bVar28;
  int iVar29;
  long lVar30;
  undefined1 (*pauVar31) [32];
  byte bVar32;
  ulong uVar33;
  byte bVar34;
  uint uVar35;
  ulong *puVar36;
  NodeRef root;
  long lVar37;
  byte bVar38;
  undefined4 uVar39;
  ulong uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  vfloat_impl<8> vVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  vfloat_impl<8> vVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 in_ZMM7 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar87 [64];
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar89 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2bf0;
  Precalculations local_2bc9;
  size_t local_2bc8;
  RTCFilterFunctionNArguments local_2bc0;
  RayK<8> *local_2b90;
  undefined4 local_2b88;
  undefined4 local_2b84;
  undefined1 local_2b80 [32];
  Geometry *local_2b50;
  undefined1 (*local_2b48) [32];
  undefined1 local_2b40 [32];
  BVH *local_2b18;
  Intersectors *local_2b10;
  long local_2b08;
  long local_2b00;
  long local_2af8;
  undefined8 local_2af0;
  undefined8 uStack_2ae8;
  undefined1 local_2ae0 [32];
  undefined1 local_2ac0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2aa0;
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2a80;
  RTCRayN local_2a60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2a40;
  undefined1 local_29e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_29c0;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  uint local_2960;
  uint uStack_295c;
  uint uStack_2958;
  uint uStack_2954;
  uint uStack_2950;
  uint uStack_294c;
  uint uStack_2948;
  uint uStack_2944;
  uint local_2940;
  uint uStack_293c;
  uint uStack_2938;
  uint uStack_2934;
  uint uStack_2930;
  uint uStack_292c;
  uint uStack_2928;
  uint uStack_2924;
  int local_2920 [8];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2900;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_28c0;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  undefined1 local_27c0 [8];
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  int local_27a0;
  int iStack_279c;
  int iStack_2798;
  int iStack_2794;
  int iStack_2790;
  int iStack_278c;
  int iStack_2788;
  int iStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  uint local_2760;
  uint uStack_275c;
  uint uStack_2758;
  uint uStack_2754;
  uint uStack_2750;
  uint uStack_274c;
  uint uStack_2748;
  uint uStack_2744;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar84 [32];
  
  local_2b18 = (BVH *)This->ptr;
  local_2608 = (local_2b18->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar41 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar74 = ZEXT816(0) << 0x40;
      uVar40 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar74),5);
      uVar16 = vpcmpeqd_avx512vl(auVar41,(undefined1  [32])valid_i->field_0);
      uVar40 = uVar40 & uVar16;
      bVar34 = (byte)uVar40;
      if (bVar34 != 0) {
        local_28c0._0_8_ = *(undefined8 *)ray;
        local_28c0._8_8_ = *(undefined8 *)(ray + 8);
        local_28c0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_28c0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_28c0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_28c0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_28c0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_28c0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_28c0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_28c0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_28c0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_28c0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2860 = *(undefined1 (*) [32])(ray + 0x80);
        local_2840 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2820 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar98 = ZEXT3264(auVar41);
        vandps_avx512vl(local_2860,auVar41);
        auVar80._8_4_ = 0x219392ef;
        auVar80._0_8_ = 0x219392ef219392ef;
        auVar80._12_4_ = 0x219392ef;
        auVar80._16_4_ = 0x219392ef;
        auVar80._20_4_ = 0x219392ef;
        auVar80._24_4_ = 0x219392ef;
        auVar80._28_4_ = 0x219392ef;
        uVar16 = vcmpps_avx512vl(auVar41,auVar80,1);
        auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar99 = ZEXT3264(auVar42);
        auVar43 = vdivps_avx512vl(auVar42,local_2860);
        vandps_avx512vl(local_2840,auVar41);
        uVar12 = vcmpps_avx512vl(auVar43,auVar80,1);
        auVar44 = vdivps_avx512vl(auVar42,local_2840);
        vandps_avx512vl(local_2820,auVar41);
        uVar33 = vcmpps_avx512vl(auVar44,auVar80,1);
        auVar41 = vdivps_avx512vl(auVar42,local_2820);
        auVar81 = ZEXT3264(CONCAT428(0x5d5e0b6b,
                                     CONCAT424(0x5d5e0b6b,
                                               CONCAT420(0x5d5e0b6b,
                                                         CONCAT416(0x5d5e0b6b,
                                                                   CONCAT412(0x5d5e0b6b,
                                                                             CONCAT48(0x5d5e0b6b,
                                                                                                                                                                            
                                                  0x5d5e0b6b5d5e0b6b)))))));
        bVar28 = (bool)((byte)uVar16 & 1);
        local_2800._0_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._0_4_;
        bVar28 = (bool)((byte)(uVar16 >> 1) & 1);
        local_2800._4_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._4_4_;
        bVar28 = (bool)((byte)(uVar16 >> 2) & 1);
        fStack_27f8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._8_4_);
        bVar28 = (bool)((byte)(uVar16 >> 3) & 1);
        fStack_27f4 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._12_4_);
        bVar28 = (bool)((byte)(uVar16 >> 4) & 1);
        fStack_27f0 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._16_4_);
        bVar28 = (bool)((byte)(uVar16 >> 5) & 1);
        fStack_27ec = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._20_4_);
        bVar28 = (bool)((byte)(uVar16 >> 6) & 1);
        fStack_27e8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._24_4_);
        bVar28 = SUB81(uVar16 >> 7,0);
        register0x00000918 = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar43._28_4_;
        bVar28 = (bool)((byte)uVar12 & 1);
        local_27e0._0_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._0_4_;
        bVar28 = (bool)((byte)(uVar12 >> 1) & 1);
        local_27e0._4_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._4_4_;
        bVar28 = (bool)((byte)(uVar12 >> 2) & 1);
        fStack_27d8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._8_4_);
        bVar28 = (bool)((byte)(uVar12 >> 3) & 1);
        fStack_27d4 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._12_4_);
        bVar28 = (bool)((byte)(uVar12 >> 4) & 1);
        fStack_27d0 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._16_4_);
        bVar28 = (bool)((byte)(uVar12 >> 5) & 1);
        fStack_27cc = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._20_4_);
        bVar28 = (bool)((byte)(uVar12 >> 6) & 1);
        fStack_27c8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._24_4_);
        bVar28 = SUB81(uVar12 >> 7,0);
        register0x00000918 = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar44._28_4_;
        bVar28 = (bool)((byte)uVar33 & 1);
        local_27c0._0_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._0_4_;
        bVar28 = (bool)((byte)(uVar33 >> 1) & 1);
        local_27c0._4_4_ = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._4_4_;
        bVar28 = (bool)((byte)(uVar33 >> 2) & 1);
        fStack_27b8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._8_4_);
        bVar28 = (bool)((byte)(uVar33 >> 3) & 1);
        fStack_27b4 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._12_4_);
        bVar28 = (bool)((byte)(uVar33 >> 4) & 1);
        fStack_27b0 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._16_4_);
        bVar28 = (bool)((byte)(uVar33 >> 5) & 1);
        fStack_27ac = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._20_4_);
        bVar28 = (bool)((byte)(uVar33 >> 6) & 1);
        fStack_27a8 = (float)((uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._24_4_);
        bVar28 = SUB81(uVar33 >> 7,0);
        register0x00000918 = (uint)bVar28 * 0x5d5e0b6b | (uint)!bVar28 * auVar41._28_4_;
        uVar16 = vcmpps_avx512vl(_local_2800,ZEXT1632(auVar74),1);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27a0 = (uint)((byte)uVar16 & 1) * auVar41._0_4_;
        iStack_279c = (uint)((byte)(uVar16 >> 1) & 1) * auVar41._4_4_;
        iStack_2798 = (uint)((byte)(uVar16 >> 2) & 1) * auVar41._8_4_;
        iStack_2794 = (uint)((byte)(uVar16 >> 3) & 1) * auVar41._12_4_;
        iStack_2790 = (uint)((byte)(uVar16 >> 4) & 1) * auVar41._16_4_;
        iStack_278c = (uint)((byte)(uVar16 >> 5) & 1) * auVar41._20_4_;
        iStack_2788 = (uint)((byte)(uVar16 >> 6) & 1) * auVar41._24_4_;
        iStack_2784 = (uint)(byte)(uVar16 >> 7) * auVar41._28_4_;
        auVar42 = ZEXT1632(auVar74);
        uVar16 = vcmpps_avx512vl(_local_27e0,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar28 = (bool)((byte)uVar16 & 1);
        bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar16 >> 6) & 1);
        bVar11 = SUB81(uVar16 >> 7,0);
        local_2780 = (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * 0x30;
        uStack_277c = (uint)bVar5 * auVar41._4_4_ | (uint)!bVar5 * 0x30;
        uStack_2778 = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * 0x30;
        uStack_2774 = (uint)bVar7 * auVar41._12_4_ | (uint)!bVar7 * 0x30;
        uStack_2770 = (uint)bVar8 * auVar41._16_4_ | (uint)!bVar8 * 0x30;
        uStack_276c = (uint)bVar9 * auVar41._20_4_ | (uint)!bVar9 * 0x30;
        uStack_2768 = (uint)bVar10 * auVar41._24_4_ | (uint)!bVar10 * 0x30;
        uStack_2764 = (uint)bVar11 * auVar41._28_4_ | (uint)!bVar11 * 0x30;
        uVar16 = vcmpps_avx512vl(_local_27c0,auVar42,5);
        auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar28 = (bool)((byte)uVar16 & 1);
        bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar16 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar16 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar16 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar16 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar16 >> 6) & 1);
        bVar11 = SUB81(uVar16 >> 7,0);
        local_2760 = (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * 0x50;
        uStack_275c = (uint)bVar5 * auVar41._4_4_ | (uint)!bVar5 * 0x50;
        uStack_2758 = (uint)bVar6 * auVar41._8_4_ | (uint)!bVar6 * 0x50;
        uStack_2754 = (uint)bVar7 * auVar41._12_4_ | (uint)!bVar7 * 0x50;
        uStack_2750 = (uint)bVar8 * auVar41._16_4_ | (uint)!bVar8 * 0x50;
        uStack_274c = (uint)bVar9 * auVar41._20_4_ | (uint)!bVar9 * 0x50;
        uStack_2748 = (uint)bVar10 * auVar41._24_4_ | (uint)!bVar10 * 0x50;
        uStack_2744 = (uint)bVar11 * auVar41._28_4_ | (uint)!bVar11 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar100 = ZEXT3264(local_1e80);
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar42);
        local_2740._0_4_ =
             (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * local_1e80._0_4_;
        bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
        local_2740._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * local_1e80._4_4_;
        bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
        local_2740._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * local_1e80._8_4_;
        bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
        local_2740._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * local_1e80._12_4_;
        bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
        local_2740._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * local_1e80._16_4_;
        bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
        local_2740._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * local_1e80._20_4_;
        bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
        local_2740._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * local_1e80._24_4_;
        bVar28 = SUB81(uVar40 >> 7,0);
        local_2740._28_4_ = (uint)bVar28 * auVar41._28_4_ | (uint)!bVar28 * local_1e80._28_4_;
        local_2b88 = (undefined4)uVar40;
        auVar41 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar42);
        local_2720._0_4_ =
             (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
        local_2720._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
        local_2720._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
        local_2720._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
        local_2720._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
        local_2720._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
        local_2720._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * -0x800000;
        bVar28 = SUB81(uVar40 >> 7,0);
        local_2720._28_4_ = (uint)bVar28 * auVar41._28_4_ | (uint)!bVar28 * -0x800000;
        local_2bf0 = (uint)(byte)~bVar34;
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar35 = 5;
        }
        else {
          uVar35 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2b90 = ray + 0x100;
        puVar36 = local_2600;
        pauVar31 = (undefined1 (*) [32])local_1e40;
        local_2610 = 0xfffffffffffffff8;
        local_1e60 = local_2740;
        local_2b48 = (undefined1 (*) [32])&local_2960;
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar101 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar102 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar103 = ZEXT3264(auVar41);
        auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar97 = ZEXT3264(auVar41);
        local_2b10 = This;
LAB_01d064fd:
        do {
          do {
            root.ptr = puVar36[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_01d078af;
            puVar36 = puVar36 + -1;
            auVar41 = pauVar31[-1];
            auVar89 = ZEXT3264(auVar41);
            pauVar31 = pauVar31 + -1;
            uVar40 = vcmpps_avx512vl(auVar41,local_2720,1);
          } while ((char)uVar40 == '\0');
          uVar39 = (undefined4)uVar40;
          if (uVar35 < (uint)POPCOUNT(uVar39)) {
LAB_01d06545:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_01d078af;
                uVar13 = vcmpps_avx512vl(auVar89._0_32_,local_2720,9);
                if ((char)uVar13 == '\0') goto LAB_01d064fd;
                local_2b08 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar34 = ~(byte)local_2bf0;
                local_2bc8 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar30 = 0;
                goto LAB_01d0671c;
              }
              uVar40 = 8;
              auVar41 = auVar100._0_32_;
              for (lVar30 = 0;
                  (auVar89 = ZEXT3264(auVar41), lVar30 != 4 &&
                  (uVar16 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar30 * 8), uVar16 != 8));
                  lVar30 = lVar30 + 1) {
                uVar39 = *(undefined4 *)(root.ptr + 0x20 + lVar30 * 4);
                auVar67._4_4_ = uVar39;
                auVar67._0_4_ = uVar39;
                auVar67._8_4_ = uVar39;
                auVar67._12_4_ = uVar39;
                auVar67._16_4_ = uVar39;
                auVar67._20_4_ = uVar39;
                auVar67._24_4_ = uVar39;
                auVar67._28_4_ = uVar39;
                auVar25._8_8_ = local_28c0._8_8_;
                auVar25._0_8_ = local_28c0._0_8_;
                auVar25._16_8_ = local_28c0._16_8_;
                auVar25._24_8_ = local_28c0._24_8_;
                auVar26._8_8_ = local_28c0._40_8_;
                auVar26._0_8_ = local_28c0._32_8_;
                auVar26._16_8_ = local_28c0._48_8_;
                auVar26._24_8_ = local_28c0._56_8_;
                auVar27._8_8_ = local_28c0._72_8_;
                auVar27._0_8_ = local_28c0._64_8_;
                auVar27._16_8_ = local_28c0._80_8_;
                auVar27._24_8_ = local_28c0._88_8_;
                auVar42 = vsubps_avx(auVar67,auVar25);
                auVar89._0_4_ = (float)local_2800._0_4_ * auVar42._0_4_;
                auVar89._4_4_ = (float)local_2800._4_4_ * auVar42._4_4_;
                auVar89._8_4_ = fStack_27f8 * auVar42._8_4_;
                auVar89._12_4_ = fStack_27f4 * auVar42._12_4_;
                auVar89._16_4_ = fStack_27f0 * auVar42._16_4_;
                auVar89._20_4_ = fStack_27ec * auVar42._20_4_;
                auVar89._28_36_ = auVar81._28_36_;
                auVar89._24_4_ = fStack_27e8 * auVar42._24_4_;
                auVar80 = auVar89._0_32_;
                auVar81 = ZEXT3264(auVar80);
                uVar39 = *(undefined4 *)(root.ptr + 0x40 + lVar30 * 4);
                auVar68._4_4_ = uVar39;
                auVar68._0_4_ = uVar39;
                auVar68._8_4_ = uVar39;
                auVar68._12_4_ = uVar39;
                auVar68._16_4_ = uVar39;
                auVar68._20_4_ = uVar39;
                auVar68._24_4_ = uVar39;
                auVar68._28_4_ = uVar39;
                auVar42 = vsubps_avx(auVar68,auVar26);
                auVar85._0_4_ = (float)local_27e0._0_4_ * auVar42._0_4_;
                auVar85._4_4_ = (float)local_27e0._4_4_ * auVar42._4_4_;
                auVar85._8_4_ = fStack_27d8 * auVar42._8_4_;
                auVar85._12_4_ = fStack_27d4 * auVar42._12_4_;
                auVar85._16_4_ = fStack_27d0 * auVar42._16_4_;
                auVar85._20_4_ = fStack_27cc * auVar42._20_4_;
                auVar85._28_36_ = in_ZMM7._28_36_;
                auVar85._24_4_ = fStack_27c8 * auVar42._24_4_;
                auVar84 = auVar85._0_32_;
                in_ZMM7 = ZEXT3264(auVar84);
                uVar39 = *(undefined4 *)(root.ptr + 0x60 + lVar30 * 4);
                auVar69._4_4_ = uVar39;
                auVar69._0_4_ = uVar39;
                auVar69._8_4_ = uVar39;
                auVar69._12_4_ = uVar39;
                auVar69._16_4_ = uVar39;
                auVar69._20_4_ = uVar39;
                auVar69._24_4_ = uVar39;
                auVar69._28_4_ = uVar39;
                auVar42 = vsubps_avx(auVar69,auVar27);
                auVar87._0_4_ = (float)local_27c0._0_4_ * auVar42._0_4_;
                auVar87._4_4_ = (float)local_27c0._4_4_ * auVar42._4_4_;
                auVar87._8_4_ = fStack_27b8 * auVar42._8_4_;
                auVar87._12_4_ = fStack_27b4 * auVar42._12_4_;
                auVar87._16_4_ = fStack_27b0 * auVar42._16_4_;
                auVar87._20_4_ = fStack_27ac * auVar42._20_4_;
                auVar87._28_36_ = in_ZMM9._28_36_;
                auVar87._24_4_ = fStack_27a8 * auVar42._24_4_;
                auVar73 = auVar87._0_32_;
                in_ZMM9 = ZEXT3264(auVar73);
                uVar39 = *(undefined4 *)(root.ptr + 0x30 + lVar30 * 4);
                auVar70._4_4_ = uVar39;
                auVar70._0_4_ = uVar39;
                auVar70._8_4_ = uVar39;
                auVar70._12_4_ = uVar39;
                auVar70._16_4_ = uVar39;
                auVar70._20_4_ = uVar39;
                auVar70._24_4_ = uVar39;
                auVar70._28_4_ = uVar39;
                auVar42 = vsubps_avx(auVar70,auVar25);
                auVar19._4_4_ = (float)local_2800._4_4_ * auVar42._4_4_;
                auVar19._0_4_ = (float)local_2800._0_4_ * auVar42._0_4_;
                auVar19._8_4_ = fStack_27f8 * auVar42._8_4_;
                auVar19._12_4_ = fStack_27f4 * auVar42._12_4_;
                auVar19._16_4_ = fStack_27f0 * auVar42._16_4_;
                auVar19._20_4_ = fStack_27ec * auVar42._20_4_;
                auVar19._24_4_ = fStack_27e8 * auVar42._24_4_;
                auVar19._28_4_ = (int)((ulong)local_28c0._24_8_ >> 0x20);
                uVar39 = *(undefined4 *)(root.ptr + 0x50 + lVar30 * 4);
                auVar71._4_4_ = uVar39;
                auVar71._0_4_ = uVar39;
                auVar71._8_4_ = uVar39;
                auVar71._12_4_ = uVar39;
                auVar71._16_4_ = uVar39;
                auVar71._20_4_ = uVar39;
                auVar71._24_4_ = uVar39;
                auVar71._28_4_ = uVar39;
                auVar42 = vsubps_avx(auVar71,auVar26);
                auVar20._4_4_ = (float)local_27e0._4_4_ * auVar42._4_4_;
                auVar20._0_4_ = (float)local_27e0._0_4_ * auVar42._0_4_;
                auVar20._8_4_ = fStack_27d8 * auVar42._8_4_;
                auVar20._12_4_ = fStack_27d4 * auVar42._12_4_;
                auVar20._16_4_ = fStack_27d0 * auVar42._16_4_;
                auVar20._20_4_ = fStack_27cc * auVar42._20_4_;
                auVar20._24_4_ = fStack_27c8 * auVar42._24_4_;
                auVar20._28_4_ = (int)((ulong)local_28c0._56_8_ >> 0x20);
                uVar39 = *(undefined4 *)(root.ptr + 0x70 + lVar30 * 4);
                auVar72._4_4_ = uVar39;
                auVar72._0_4_ = uVar39;
                auVar72._8_4_ = uVar39;
                auVar72._12_4_ = uVar39;
                auVar72._16_4_ = uVar39;
                auVar72._20_4_ = uVar39;
                auVar72._24_4_ = uVar39;
                auVar72._28_4_ = uVar39;
                auVar42 = vsubps_avx(auVar72,auVar27);
                auVar21._4_4_ = (float)local_27c0._4_4_ * auVar42._4_4_;
                auVar21._0_4_ = (float)local_27c0._0_4_ * auVar42._0_4_;
                auVar21._8_4_ = fStack_27b8 * auVar42._8_4_;
                auVar21._12_4_ = fStack_27b4 * auVar42._12_4_;
                auVar21._16_4_ = fStack_27b0 * auVar42._16_4_;
                auVar21._20_4_ = fStack_27ac * auVar42._20_4_;
                auVar21._24_4_ = fStack_27a8 * auVar42._24_4_;
                auVar21._28_4_ = (int)((ulong)local_28c0._88_8_ >> 0x20);
                auVar42 = vminps_avx(auVar80,auVar19);
                auVar43 = vminps_avx(auVar84,auVar20);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar43 = vminps_avx(auVar73,auVar21);
                auVar42 = vmaxps_avx(auVar42,auVar43);
                auVar44 = vmulps_avx512vl(auVar42,auVar101._0_32_);
                auVar42 = vmaxps_avx(auVar80,auVar19);
                auVar43 = vmaxps_avx(auVar84,auVar20);
                auVar43 = vminps_avx(auVar42,auVar43);
                auVar42 = vmaxps_avx(auVar73,auVar21);
                auVar42 = vminps_avx(auVar43,auVar42);
                auVar43 = vmulps_avx512vl(auVar42,auVar102._0_32_);
                auVar42 = vmaxps_avx(auVar44,local_2740);
                auVar43 = vminps_avx(auVar43,local_2720);
                uVar12 = vcmpps_avx512vl(auVar42,auVar43,2);
                uVar33 = uVar40;
                auVar45 = auVar41;
                if ((byte)uVar12 != 0) {
                  auVar42 = vblendmps_avx512vl(auVar100._0_32_,auVar44);
                  bVar28 = (bool)((byte)uVar12 & 1);
                  auVar45._0_4_ = (uint)bVar28 * auVar42._0_4_ | (uint)!bVar28 * auVar44._0_4_;
                  bVar28 = (bool)((byte)(uVar12 >> 1) & 1);
                  auVar45._4_4_ = (uint)bVar28 * auVar42._4_4_ | (uint)!bVar28 * auVar44._4_4_;
                  bVar28 = (bool)((byte)(uVar12 >> 2) & 1);
                  auVar45._8_4_ = (uint)bVar28 * auVar42._8_4_ | (uint)!bVar28 * auVar44._8_4_;
                  bVar28 = (bool)((byte)(uVar12 >> 3) & 1);
                  auVar45._12_4_ = (uint)bVar28 * auVar42._12_4_ | (uint)!bVar28 * auVar44._12_4_;
                  bVar28 = (bool)((byte)(uVar12 >> 4) & 1);
                  auVar45._16_4_ = (uint)bVar28 * auVar42._16_4_ | (uint)!bVar28 * auVar44._16_4_;
                  bVar28 = (bool)((byte)(uVar12 >> 5) & 1);
                  auVar45._20_4_ = (uint)bVar28 * auVar42._20_4_ | (uint)!bVar28 * auVar44._20_4_;
                  bVar28 = (bool)((byte)(uVar12 >> 6) & 1);
                  auVar45._24_4_ = (uint)bVar28 * auVar42._24_4_ | (uint)!bVar28 * auVar44._24_4_;
                  bVar28 = SUB81(uVar12 >> 7,0);
                  auVar45._28_4_ = (uint)bVar28 * auVar42._28_4_ | (uint)!bVar28 * auVar44._28_4_;
                  uVar33 = uVar16;
                  if (uVar40 != 8) {
                    *puVar36 = uVar40;
                    puVar36 = puVar36 + 1;
                    *pauVar31 = auVar41;
                    pauVar31 = pauVar31 + 1;
                  }
                }
                auVar41 = auVar45;
                uVar40 = uVar33;
              }
              if (uVar40 == 8) goto LAB_01d066c3;
              uVar13 = vcmpps_avx512vl(auVar41,local_2720,9);
              root.ptr = uVar40;
            } while ((byte)uVar35 < (byte)POPCOUNT((int)uVar13));
            *puVar36 = uVar40;
            puVar36 = puVar36 + 1;
            *pauVar31 = auVar41;
            pauVar31 = pauVar31 + 1;
LAB_01d066c3:
            iVar29 = 4;
          }
          else {
            while (local_2b80 = auVar41, bVar34 = (byte)local_2bf0, uVar40 != 0) {
              local_2bc8 = 0;
              for (uVar16 = uVar40; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                local_2bc8 = local_2bc8 + 1;
              }
              uVar40 = uVar40 - 1 & uVar40;
              auVar81 = ZEXT1664(auVar81._0_16_);
              in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
              in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
              bVar28 = occluded1(local_2b10,local_2b18,root,local_2bc8,&local_2bc9,ray,
                                 (TravRayK<8,_true> *)&local_28c0.field_0,context);
              bVar32 = (byte)(1 << ((uint)local_2bc8 & 0x1f));
              if (!bVar28) {
                bVar32 = 0;
              }
              local_2bf0 = (uint)(bVar34 | bVar32);
              auVar41 = local_2b80;
            }
            iVar29 = 3;
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar98 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar99 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar100 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar101 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar102 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar103 = ZEXT3264(auVar41);
            auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar97 = ZEXT3264(auVar41);
            auVar89 = ZEXT3264(local_2b80);
            if (bVar34 != 0xff) {
              auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2720._0_4_ =
                   (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * local_2720._0_4_
              ;
              bVar28 = (bool)((byte)(local_2bf0 >> 1) & 1);
              local_2720._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * local_2720._4_4_;
              bVar28 = (bool)((byte)(local_2bf0 >> 2) & 1);
              local_2720._8_4_ = (uint)bVar28 * auVar41._8_4_ | (uint)!bVar28 * local_2720._8_4_;
              bVar28 = (bool)((byte)(local_2bf0 >> 3) & 1);
              local_2720._12_4_ = (uint)bVar28 * auVar41._12_4_ | (uint)!bVar28 * local_2720._12_4_;
              bVar28 = (bool)((byte)(local_2bf0 >> 4) & 1);
              local_2720._16_4_ = (uint)bVar28 * auVar41._16_4_ | (uint)!bVar28 * local_2720._16_4_;
              bVar28 = (bool)((byte)(local_2bf0 >> 5) & 1);
              local_2720._20_4_ = (uint)bVar28 * auVar41._20_4_ | (uint)!bVar28 * local_2720._20_4_;
              bVar28 = (bool)((byte)(local_2bf0 >> 6) & 1);
              local_2720._24_4_ = (uint)bVar28 * auVar41._24_4_ | (uint)!bVar28 * local_2720._24_4_;
              local_2720._28_4_ =
                   (local_2bf0 >> 7) * auVar41._28_4_ |
                   (uint)!SUB41(local_2bf0 >> 7,0) * local_2720._28_4_;
              iVar29 = 2;
            }
            if (uVar35 < (uint)POPCOUNT(uVar39)) goto LAB_01d06545;
          }
        } while (iVar29 != 3);
LAB_01d078af:
        local_2bf0._0_1_ = (byte)local_2bf0 & (byte)local_2b88;
        bVar28 = (bool)((byte)local_2bf0 >> 1 & 1);
        bVar5 = (bool)((byte)local_2bf0 >> 2 & 1);
        bVar6 = (bool)((byte)local_2bf0 >> 3 & 1);
        bVar7 = (bool)((byte)local_2bf0 >> 4 & 1);
        bVar8 = (bool)((byte)local_2bf0 >> 5 & 1);
        bVar9 = (bool)((byte)local_2bf0 >> 6 & 1);
        *(uint *)local_2b90 =
             (uint)((byte)local_2bf0 & 1) * -0x800000 |
             (uint)!(bool)((byte)local_2bf0 & 1) * *(int *)local_2b90;
        *(uint *)(local_2b90 + 4) =
             (uint)bVar28 * -0x800000 | (uint)!bVar28 * *(int *)(local_2b90 + 4);
        *(uint *)(local_2b90 + 8) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_2b90 + 8);
        *(uint *)(local_2b90 + 0xc) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_2b90 + 0xc);
        *(uint *)(local_2b90 + 0x10) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_2b90 + 0x10);
        *(uint *)(local_2b90 + 0x14) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_2b90 + 0x14);
        *(uint *)(local_2b90 + 0x18) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_2b90 + 0x18);
        *(uint *)(local_2b90 + 0x1c) =
             (uint)((byte)local_2bf0 >> 7) * -0x800000 |
             (uint)!(bool)((byte)local_2bf0 >> 7) * *(int *)(local_2b90 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_01d0671c:
  do {
    if (lVar30 == local_2b08) goto LAB_01d07757;
    local_2af8 = lVar30 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    lVar37 = 0;
    local_2b00 = lVar30;
    bVar32 = bVar34;
    do {
      if (lVar37 == 4) goto LAB_01d0773b;
      uVar40 = CONCAT44(0,*(uint *)(local_2bc8 + lVar37 * 4));
      local_2b80._0_8_ = uVar40;
      if (uVar40 == 0xffffffff) goto LAB_01d0773b;
      uVar39 = *(undefined4 *)(local_2bc8 + -0xc0 + lVar37 * 4);
      auVar73._4_4_ = uVar39;
      auVar73._0_4_ = uVar39;
      auVar73._8_4_ = uVar39;
      auVar73._12_4_ = uVar39;
      auVar73._16_4_ = uVar39;
      auVar73._20_4_ = uVar39;
      auVar73._24_4_ = uVar39;
      auVar73._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(local_2bc8 + -0xb0 + lVar37 * 4);
      auVar75._4_4_ = uVar39;
      auVar75._0_4_ = uVar39;
      auVar75._8_4_ = uVar39;
      auVar75._12_4_ = uVar39;
      auVar75._16_4_ = uVar39;
      auVar75._20_4_ = uVar39;
      auVar75._24_4_ = uVar39;
      auVar75._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(local_2bc8 + -0xa0 + lVar37 * 4);
      auVar76._4_4_ = uVar39;
      auVar76._0_4_ = uVar39;
      auVar76._8_4_ = uVar39;
      auVar76._12_4_ = uVar39;
      auVar76._16_4_ = uVar39;
      auVar76._20_4_ = uVar39;
      auVar76._24_4_ = uVar39;
      auVar76._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(local_2bc8 + -0x90 + lVar37 * 4);
      local_2ac0._4_4_ = uVar39;
      local_2ac0._0_4_ = uVar39;
      local_2ac0._8_4_ = uVar39;
      local_2ac0._12_4_ = uVar39;
      local_2ac0._16_4_ = uVar39;
      local_2ac0._20_4_ = uVar39;
      local_2ac0._24_4_ = uVar39;
      local_2ac0._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(local_2bc8 + -0x80 + lVar37 * 4);
      local_2ae0._4_4_ = uVar39;
      local_2ae0._0_4_ = uVar39;
      local_2ae0._8_4_ = uVar39;
      local_2ae0._12_4_ = uVar39;
      local_2ae0._16_4_ = uVar39;
      local_2ae0._20_4_ = uVar39;
      local_2ae0._24_4_ = uVar39;
      local_2ae0._28_4_ = uVar39;
      local_2640 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_2bc8 + -0x70 + lVar37 * 4)));
      local_2660 = *(undefined4 *)(local_2bc8 + -0x60 + lVar37 * 4);
      uStack_265c = local_2660;
      uStack_2658 = local_2660;
      uStack_2654 = local_2660;
      uStack_2650 = local_2660;
      uStack_264c = local_2660;
      uStack_2648 = local_2660;
      uStack_2644 = local_2660;
      local_2680 = *(undefined4 *)(local_2bc8 + -0x50 + lVar37 * 4);
      uStack_267c = local_2680;
      uStack_2678 = local_2680;
      uStack_2674 = local_2680;
      uStack_2670 = local_2680;
      uStack_266c = local_2680;
      uStack_2668 = local_2680;
      uStack_2664 = local_2680;
      local_26a0 = *(undefined4 *)(local_2bc8 + -0x40 + lVar37 * 4);
      uStack_269c = local_26a0;
      uStack_2698 = local_26a0;
      uStack_2694 = local_26a0;
      uStack_2690 = local_26a0;
      uStack_268c = local_26a0;
      uStack_2688 = local_26a0;
      uStack_2684 = local_26a0;
      local_26c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_2bc8 + -0x30 + lVar37 * 4)));
      local_26e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_2bc8 + -0x20 + lVar37 * 4)));
      local_2700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_2bc8 + -0x10 + lVar37 * 4)));
      local_2af0 = *(undefined8 *)(local_2af8 + 0xd0);
      uStack_2ae8 = *(undefined8 *)(local_2af8 + 0xd8);
      auVar41 = *(undefined1 (*) [32])ray;
      auVar42 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43 = *(undefined1 (*) [32])(ray + 0x40);
      auVar44 = *(undefined1 (*) [32])(ray + 0x80);
      auVar80 = *(undefined1 (*) [32])(ray + 0xa0);
      in_ZMM7 = ZEXT3264(auVar80);
      auVar84 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar73 = vsubps_avx(auVar73,auVar41);
      auVar75 = vsubps_avx(auVar75,auVar42);
      auVar81 = ZEXT3264(auVar75);
      auVar76 = vsubps_avx(auVar76,auVar43);
      in_ZMM9 = ZEXT3264(auVar76);
      auVar59 = vsubps_avx(local_2ac0,auVar41);
      auVar58 = vsubps_avx(local_2ae0,auVar42);
      auVar46 = vsubps_avx512vl(local_2640,auVar43);
      auVar47 = vsubps_avx512vl(local_26c0,auVar41);
      auVar48 = vsubps_avx512vl(local_26e0,auVar42);
      auVar49 = vsubps_avx512vl(local_2700,auVar43);
      auVar50 = vsubps_avx512vl(auVar47,auVar73);
      auVar51 = vsubps_avx512vl(auVar48,auVar75);
      auVar52 = vsubps_avx512vl(auVar49,auVar76);
      auVar53 = vsubps_avx512vl(auVar73,auVar59);
      auVar54 = vsubps_avx512vl(auVar75,auVar58);
      auVar55 = vsubps_avx512vl(auVar76,auVar46);
      auVar56 = vaddps_avx512vl(auVar47,auVar73);
      auVar57 = vaddps_avx512vl(auVar48,auVar75);
      auVar43 = vaddps_avx512vl(auVar49,auVar76);
      auVar42._4_4_ = auVar52._4_4_ * auVar57._4_4_;
      auVar42._0_4_ = auVar52._0_4_ * auVar57._0_4_;
      auVar42._8_4_ = auVar52._8_4_ * auVar57._8_4_;
      auVar42._12_4_ = auVar52._12_4_ * auVar57._12_4_;
      auVar42._16_4_ = auVar52._16_4_ * auVar57._16_4_;
      auVar42._20_4_ = auVar52._20_4_ * auVar57._20_4_;
      auVar42._24_4_ = auVar52._24_4_ * auVar57._24_4_;
      auVar42._28_4_ = auVar41._28_4_;
      auVar17 = vfmsub231ps_fma(auVar42,auVar51,auVar43);
      auVar41._4_4_ = auVar50._4_4_ * auVar43._4_4_;
      auVar41._0_4_ = auVar50._0_4_ * auVar43._0_4_;
      auVar41._8_4_ = auVar50._8_4_ * auVar43._8_4_;
      auVar41._12_4_ = auVar50._12_4_ * auVar43._12_4_;
      auVar41._16_4_ = auVar50._16_4_ * auVar43._16_4_;
      auVar41._20_4_ = auVar50._20_4_ * auVar43._20_4_;
      auVar41._24_4_ = auVar50._24_4_ * auVar43._24_4_;
      auVar41._28_4_ = auVar43._28_4_;
      auVar74 = vfmsub231ps_fma(auVar41,auVar52,auVar56);
      auVar43._4_4_ = auVar51._4_4_ * auVar56._4_4_;
      auVar43._0_4_ = auVar51._0_4_ * auVar56._0_4_;
      auVar43._8_4_ = auVar51._8_4_ * auVar56._8_4_;
      auVar43._12_4_ = auVar51._12_4_ * auVar56._12_4_;
      auVar43._16_4_ = auVar51._16_4_ * auVar56._16_4_;
      auVar43._20_4_ = auVar51._20_4_ * auVar56._20_4_;
      auVar43._24_4_ = auVar51._24_4_ * auVar56._24_4_;
      auVar43._28_4_ = auVar56._28_4_;
      auVar79 = vfmsub231ps_fma(auVar43,auVar50,auVar57);
      fVar88 = auVar84._0_4_;
      auVar57._0_4_ = fVar88 * auVar79._0_4_;
      fVar90 = auVar84._4_4_;
      auVar57._4_4_ = fVar90 * auVar79._4_4_;
      fVar91 = auVar84._8_4_;
      auVar57._8_4_ = fVar91 * auVar79._8_4_;
      fVar92 = auVar84._12_4_;
      auVar57._12_4_ = fVar92 * auVar79._12_4_;
      fVar93 = auVar84._16_4_;
      auVar57._16_4_ = fVar93 * 0.0;
      fVar94 = auVar84._20_4_;
      auVar57._20_4_ = fVar94 * 0.0;
      fVar95 = auVar84._24_4_;
      auVar57._24_4_ = fVar95 * 0.0;
      auVar57._28_4_ = 0;
      auVar74 = vfmadd231ps_fma(auVar57,auVar80,ZEXT1632(auVar74));
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar44,ZEXT1632(auVar17));
      auVar61._0_4_ = auVar59._0_4_ + auVar73._0_4_;
      auVar61._4_4_ = auVar59._4_4_ + auVar73._4_4_;
      auVar61._8_4_ = auVar59._8_4_ + auVar73._8_4_;
      auVar61._12_4_ = auVar59._12_4_ + auVar73._12_4_;
      auVar61._16_4_ = auVar59._16_4_ + auVar73._16_4_;
      auVar61._20_4_ = auVar59._20_4_ + auVar73._20_4_;
      auVar61._24_4_ = auVar59._24_4_ + auVar73._24_4_;
      auVar61._28_4_ = auVar59._28_4_ + auVar73._28_4_;
      auVar62._0_4_ = auVar58._0_4_ + auVar75._0_4_;
      auVar62._4_4_ = auVar58._4_4_ + auVar75._4_4_;
      auVar62._8_4_ = auVar58._8_4_ + auVar75._8_4_;
      auVar62._12_4_ = auVar58._12_4_ + auVar75._12_4_;
      auVar62._16_4_ = auVar58._16_4_ + auVar75._16_4_;
      auVar62._20_4_ = auVar58._20_4_ + auVar75._20_4_;
      auVar62._24_4_ = auVar58._24_4_ + auVar75._24_4_;
      auVar62._28_4_ = auVar58._28_4_ + auVar75._28_4_;
      auVar41 = vaddps_avx512vl(auVar76,auVar46);
      auVar42 = vmulps_avx512vl(auVar62,auVar55);
      auVar42 = vfmsub231ps_avx512vl(auVar42,auVar54,auVar41);
      auVar41 = vmulps_avx512vl(auVar41,auVar53);
      auVar41 = vfmsub231ps_avx512vl(auVar41,auVar55,auVar61);
      auVar43 = vmulps_avx512vl(auVar61,auVar54);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar53,auVar62);
      auVar57 = vsubps_avx512vl(auVar59,auVar47);
      auVar56._4_4_ = fVar90 * auVar43._4_4_;
      auVar56._0_4_ = fVar88 * auVar43._0_4_;
      auVar56._8_4_ = fVar91 * auVar43._8_4_;
      auVar56._12_4_ = fVar92 * auVar43._12_4_;
      auVar56._16_4_ = fVar93 * auVar43._16_4_;
      auVar56._20_4_ = fVar94 * auVar43._20_4_;
      auVar56._24_4_ = fVar95 * auVar43._24_4_;
      auVar56._28_4_ = auVar43._28_4_;
      auVar41 = vfmadd231ps_avx512vl(auVar56,auVar80,auVar41);
      auVar43 = vsubps_avx512vl(auVar58,auVar48);
      auVar17 = vfmadd231ps_fma(auVar41,auVar44,auVar42);
      auVar41 = vsubps_avx512vl(auVar46,auVar49);
      auVar42 = vaddps_avx512vl(auVar59,auVar47);
      auVar58 = vaddps_avx512vl(auVar58,auVar48);
      auVar59 = vaddps_avx512vl(auVar46,auVar49);
      auVar56 = vmulps_avx512vl(auVar58,auVar41);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar43,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar57);
      auVar46 = vfmsub231ps_avx512vl(auVar59,auVar41,auVar42);
      auVar59._4_4_ = auVar42._4_4_ * auVar43._4_4_;
      auVar59._0_4_ = auVar42._0_4_ * auVar43._0_4_;
      auVar59._8_4_ = auVar42._8_4_ * auVar43._8_4_;
      auVar59._12_4_ = auVar42._12_4_ * auVar43._12_4_;
      auVar59._16_4_ = auVar42._16_4_ * auVar43._16_4_;
      auVar59._20_4_ = auVar42._20_4_ * auVar43._20_4_;
      auVar59._24_4_ = auVar42._24_4_ * auVar43._24_4_;
      auVar59._28_4_ = auVar42._28_4_;
      auVar79 = vfmsub231ps_fma(auVar59,auVar57,auVar58);
      auVar42 = vmulps_avx512vl(ZEXT1632(auVar79),auVar84);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar80,auVar46);
      auVar42 = vfmadd231ps_avx512vl(auVar42,auVar44,auVar56);
      auVar59 = vaddps_avx512vl(auVar42,ZEXT1632(CONCAT412(auVar74._12_4_ + auVar17._12_4_,
                                                           CONCAT48(auVar74._8_4_ + auVar17._8_4_,
                                                                    CONCAT44(auVar74._4_4_ +
                                                                             auVar17._4_4_,
                                                                             auVar74._0_4_ +
                                                                             auVar17._0_4_)))));
      auVar47 = auVar98._0_32_;
      vandps_avx512vl(auVar59,auVar47);
      auVar58 = vmulps_avx512vl(auVar59,auVar103._0_32_);
      auVar56 = vminps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar17));
      auVar56 = vminps_avx512vl(auVar56,auVar42);
      auVar46 = vxorps_avx512vl(auVar58,auVar97._0_32_);
      uVar13 = vcmpps_avx512vl(auVar56,auVar46,5);
      auVar56 = vmaxps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar17));
      auVar42 = vmaxps_avx512vl(auVar56,auVar42);
      uVar14 = vcmpps_avx512vl(auVar42,auVar58,2);
      bVar38 = ((byte)uVar13 | (byte)uVar14) & bVar32;
      if (bVar38 != 0) {
        auVar42 = vmulps_avx512vl(auVar54,auVar52);
        auVar58 = vmulps_avx512vl(auVar50,auVar55);
        auVar56 = vmulps_avx512vl(auVar53,auVar51);
        auVar46 = vmulps_avx512vl(auVar43,auVar55);
        auVar48 = vmulps_avx512vl(auVar53,auVar41);
        auVar49 = vmulps_avx512vl(auVar57,auVar54);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar42);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar53,auVar58);
        auVar50 = vfmsub213ps_avx512vl(auVar50,auVar54,auVar56);
        auVar41 = vfmsub213ps_avx512vl(auVar41,auVar54,auVar46);
        auVar54 = vfmsub213ps_avx512vl(auVar57,auVar55,auVar48);
        auVar43 = vfmsub213ps_avx512vl(auVar43,auVar53,auVar49);
        vandps_avx512vl(auVar42,auVar47);
        vandps_avx512vl(auVar46,auVar47);
        uVar16 = vcmpps_avx512vl(auVar43,auVar43,1);
        vandps_avx512vl(auVar58,auVar47);
        vandps_avx512vl(auVar48,auVar47);
        uVar12 = vcmpps_avx512vl(auVar43,auVar43,1);
        vandps_avx512vl(auVar56,auVar47);
        vandps_avx512vl(auVar49,auVar47);
        uVar33 = vcmpps_avx512vl(auVar43,auVar43,1);
        bVar28 = (bool)((byte)uVar16 & 1);
        local_2a40._0_4_ = (uint)bVar28 * auVar51._0_4_ | (uint)!bVar28 * auVar41._0_4_;
        bVar28 = (bool)((byte)(uVar16 >> 1) & 1);
        local_2a40._4_4_ = (uint)bVar28 * auVar51._4_4_ | (uint)!bVar28 * auVar41._4_4_;
        bVar28 = (bool)((byte)(uVar16 >> 2) & 1);
        local_2a40._8_4_ = (uint)bVar28 * auVar51._8_4_ | (uint)!bVar28 * auVar41._8_4_;
        bVar28 = (bool)((byte)(uVar16 >> 3) & 1);
        local_2a40._12_4_ = (uint)bVar28 * auVar51._12_4_ | (uint)!bVar28 * auVar41._12_4_;
        bVar28 = (bool)((byte)(uVar16 >> 4) & 1);
        local_2a40._16_4_ = (uint)bVar28 * auVar51._16_4_ | (uint)!bVar28 * auVar41._16_4_;
        bVar28 = (bool)((byte)(uVar16 >> 5) & 1);
        local_2a40._20_4_ = (uint)bVar28 * auVar51._20_4_ | (uint)!bVar28 * auVar41._20_4_;
        bVar28 = (bool)((byte)(uVar16 >> 6) & 1);
        local_2a40._24_4_ = (uint)bVar28 * auVar51._24_4_ | (uint)!bVar28 * auVar41._24_4_;
        bVar28 = SUB81(uVar16 >> 7,0);
        local_2a40._28_4_ = (uint)bVar28 * auVar51._28_4_ | (uint)!bVar28 * auVar41._28_4_;
        bVar28 = (bool)((byte)uVar12 & 1);
        vVar60.field_0._0_4_ = (uint)bVar28 * auVar52._0_4_ | (uint)!bVar28 * auVar54._0_4_;
        bVar28 = (bool)((byte)(uVar12 >> 1) & 1);
        vVar60.field_0._4_4_ = (uint)bVar28 * auVar52._4_4_ | (uint)!bVar28 * auVar54._4_4_;
        bVar28 = (bool)((byte)(uVar12 >> 2) & 1);
        vVar60.field_0._8_4_ = (uint)bVar28 * auVar52._8_4_ | (uint)!bVar28 * auVar54._8_4_;
        bVar28 = (bool)((byte)(uVar12 >> 3) & 1);
        vVar60.field_0._12_4_ = (uint)bVar28 * auVar52._12_4_ | (uint)!bVar28 * auVar54._12_4_;
        bVar28 = (bool)((byte)(uVar12 >> 4) & 1);
        vVar60.field_0._16_4_ = (uint)bVar28 * auVar52._16_4_ | (uint)!bVar28 * auVar54._16_4_;
        bVar28 = (bool)((byte)(uVar12 >> 5) & 1);
        vVar60.field_0._20_4_ = (uint)bVar28 * auVar52._20_4_ | (uint)!bVar28 * auVar54._20_4_;
        bVar28 = (bool)((byte)(uVar12 >> 6) & 1);
        vVar60.field_0._24_4_ = (uint)bVar28 * auVar52._24_4_ | (uint)!bVar28 * auVar54._24_4_;
        bVar28 = SUB81(uVar12 >> 7,0);
        vVar60.field_0._28_4_ = (uint)bVar28 * auVar52._28_4_ | (uint)!bVar28 * auVar54._28_4_;
        bVar28 = (bool)((byte)uVar33 & 1);
        local_2a40._64_4_ = (float)((uint)bVar28 * auVar50._0_4_ | (uint)!bVar28 * auVar43._0_4_);
        bVar28 = (bool)((byte)(uVar33 >> 1) & 1);
        local_2a40._68_4_ = (float)((uint)bVar28 * auVar50._4_4_ | (uint)!bVar28 * auVar43._4_4_);
        bVar28 = (bool)((byte)(uVar33 >> 2) & 1);
        local_2a40._72_4_ = (float)((uint)bVar28 * auVar50._8_4_ | (uint)!bVar28 * auVar43._8_4_);
        bVar28 = (bool)((byte)(uVar33 >> 3) & 1);
        local_2a40._76_4_ = (float)((uint)bVar28 * auVar50._12_4_ | (uint)!bVar28 * auVar43._12_4_);
        bVar28 = (bool)((byte)(uVar33 >> 4) & 1);
        local_2a40._80_4_ = (float)((uint)bVar28 * auVar50._16_4_ | (uint)!bVar28 * auVar43._16_4_);
        bVar28 = (bool)((byte)(uVar33 >> 5) & 1);
        local_2a40._84_4_ = (float)((uint)bVar28 * auVar50._20_4_ | (uint)!bVar28 * auVar43._20_4_);
        bVar28 = (bool)((byte)(uVar33 >> 6) & 1);
        local_2a40._88_4_ = (float)((uint)bVar28 * auVar50._24_4_ | (uint)!bVar28 * auVar43._24_4_);
        bVar28 = SUB81(uVar33 >> 7,0);
        local_2a40._92_4_ = (uint)bVar28 * auVar50._28_4_ | (uint)!bVar28 * auVar43._28_4_;
        auVar58._4_4_ = fVar90 * local_2a40._68_4_;
        auVar58._0_4_ = fVar88 * local_2a40._64_4_;
        auVar58._8_4_ = fVar91 * local_2a40._72_4_;
        auVar58._12_4_ = fVar92 * local_2a40._76_4_;
        auVar58._16_4_ = fVar93 * local_2a40._80_4_;
        auVar58._20_4_ = fVar94 * local_2a40._84_4_;
        auVar58._24_4_ = fVar95 * local_2a40._88_4_;
        auVar58._28_4_ = auVar84._28_4_;
        auVar79 = vfmadd213ps_fma(auVar80,(undefined1  [32])vVar60.field_0,auVar58);
        auVar79 = vfmadd213ps_fma(auVar44,(undefined1  [32])local_2a40.field_0.x.field_0,
                                  ZEXT1632(auVar79));
        auVar44 = ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                     CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                              CONCAT44(auVar79._4_4_ + auVar79._4_4_,
                                                       auVar79._0_4_ + auVar79._0_4_))));
        auVar84._0_4_ = auVar76._0_4_ * local_2a40._64_4_;
        auVar84._4_4_ = auVar76._4_4_ * local_2a40._68_4_;
        auVar84._8_4_ = auVar76._8_4_ * local_2a40._72_4_;
        auVar84._12_4_ = auVar76._12_4_ * local_2a40._76_4_;
        auVar84._16_4_ = auVar76._16_4_ * local_2a40._80_4_;
        auVar84._20_4_ = auVar76._20_4_ * local_2a40._84_4_;
        auVar84._24_4_ = auVar76._24_4_ * local_2a40._88_4_;
        auVar84._28_4_ = 0;
        auVar79 = vfmadd213ps_fma(auVar75,(undefined1  [32])vVar60.field_0,auVar84);
        auVar83 = vfmadd213ps_fma(auVar73,(undefined1  [32])local_2a40.field_0.x.field_0,
                                  ZEXT1632(auVar79));
        auVar41 = vrcp14ps_avx512vl(auVar44);
        auVar81 = ZEXT3264(auVar41);
        auVar42 = vxorps_avx512vl(auVar44,auVar97._0_32_);
        in_ZMM7 = ZEXT3264(auVar42);
        auVar80 = auVar99._0_32_;
        auVar43 = vfnmadd213ps_avx512vl(auVar41,auVar44,auVar80);
        auVar79 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
        in_ZMM9 = ZEXT1664(auVar79);
        local_29e0 = ZEXT1632(CONCAT412(auVar79._12_4_ * (auVar83._12_4_ + auVar83._12_4_),
                                        CONCAT48(auVar79._8_4_ * (auVar83._8_4_ + auVar83._8_4_),
                                                 CONCAT44(auVar79._4_4_ *
                                                          (auVar83._4_4_ + auVar83._4_4_),
                                                          auVar79._0_4_ *
                                                          (auVar83._0_4_ + auVar83._0_4_)))));
        uVar13 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar14 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar15 = vcmpps_avx512vl(auVar44,auVar42,4);
        bVar38 = bVar38 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
        if (bVar38 != 0) {
          pGVar2 = (context->scene->geometries).items[uVar40].ptr;
          uVar1 = pGVar2->mask;
          auVar44._4_4_ = uVar1;
          auVar44._0_4_ = uVar1;
          auVar44._8_4_ = uVar1;
          auVar44._12_4_ = uVar1;
          auVar44._16_4_ = uVar1;
          auVar44._20_4_ = uVar1;
          auVar44._24_4_ = uVar1;
          auVar44._28_4_ = uVar1;
          auVar81 = ZEXT3264(auVar44);
          uVar13 = vptestmd_avx512vl(auVar44,*(undefined1 (*) [32])(ray + 0x120));
          bVar38 = bVar38 & (byte)uVar13;
          if (bVar38 != 0) {
            local_2b84 = *(undefined4 *)((long)&local_2af0 + lVar37 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar46._8_4_ = 0x219392ef;
              auVar46._0_8_ = 0x219392ef219392ef;
              auVar46._12_4_ = 0x219392ef;
              auVar46._16_4_ = 0x219392ef;
              auVar46._20_4_ = 0x219392ef;
              auVar46._24_4_ = 0x219392ef;
              auVar46._28_4_ = 0x219392ef;
              uVar40 = vcmpps_avx512vl(auVar59,auVar46,5);
              auVar41 = vrcp14ps_avx512vl(auVar59);
              auVar43 = vfnmadd213ps_avx512vl(auVar59,auVar41,auVar80);
              auVar43 = vfmadd132ps_avx512vl(auVar43,auVar41,auVar41);
              fVar90 = (float)((uint)((byte)uVar40 & 1) * auVar43._0_4_);
              fVar88 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar43._4_4_);
              fVar91 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar43._8_4_);
              fVar92 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar43._12_4_);
              fVar93 = (float)((uint)((byte)(uVar40 >> 4) & 1) * auVar43._16_4_);
              fVar94 = (float)((uint)((byte)(uVar40 >> 5) & 1) * auVar43._20_4_);
              fVar95 = (float)((uint)((byte)(uVar40 >> 6) & 1) * auVar43._24_4_);
              auVar47._0_4_ = fVar90 * auVar74._0_4_;
              auVar47._4_4_ = fVar88 * auVar74._4_4_;
              auVar47._8_4_ = fVar91 * auVar74._8_4_;
              auVar47._12_4_ = fVar92 * auVar74._12_4_;
              auVar47._16_4_ = fVar93 * 0.0;
              auVar47._20_4_ = fVar94 * 0.0;
              auVar47._24_4_ = fVar95 * 0.0;
              auVar47._28_4_ = 0;
              local_29a0 = vminps_avx512vl(auVar47,auVar80);
              auVar48._0_4_ = fVar90 * auVar17._0_4_;
              auVar48._4_4_ = fVar88 * auVar17._4_4_;
              auVar48._8_4_ = fVar91 * auVar17._8_4_;
              auVar48._12_4_ = fVar92 * auVar17._12_4_;
              auVar48._16_4_ = fVar93 * 0.0;
              auVar48._20_4_ = fVar94 * 0.0;
              auVar48._24_4_ = fVar95 * 0.0;
              auVar48._28_4_ = 0;
              local_29c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                           vminps_avx512vl(auVar48,auVar80);
              local_2bc0.valid = local_2920;
              local_2bc0.geometryUserPtr = &local_2aa0;
              local_2bc0.context = (RTCRayQueryContext *)&local_2a80;
              local_2bc0.ray = local_2a60;
              auVar81 = ZEXT1664(auVar41._0_16_);
              in_ZMM7 = ZEXT1664(auVar42._0_16_);
              in_ZMM9 = ZEXT1664(auVar79);
              local_2b50 = pGVar2;
              local_2a40.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar60.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_2bc0,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_2a40.field_0);
              pRVar3 = context->user;
              local_2980 = vpbroadcastd_avx512vl();
              local_29a0 = vpbroadcastd_avx512vl();
              local_2a40.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2900;
              local_29c0 = local_2a80;
              auVar41 = vpcmpeqd_avx2(local_2980,local_2980);
              local_2b48[1] = auVar41;
              *local_2b48 = auVar41;
              local_2960 = pRVar3->instID[0];
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              local_2940 = pRVar3->instPrimID[0];
              uStack_293c = local_2940;
              uStack_2938 = local_2940;
              uStack_2934 = local_2940;
              uStack_2930 = local_2940;
              uStack_292c = local_2940;
              uStack_2928 = local_2940;
              uStack_2924 = local_2940;
              local_2b80 = *(undefined1 (*) [32])(ray + 0x100);
              auVar41 = vblendmps_avx512vl(local_2b80,(undefined1  [32])local_2aa0);
              bVar28 = (bool)(bVar38 >> 1 & 1);
              bVar5 = (bool)(bVar38 >> 2 & 1);
              bVar6 = (bool)(bVar38 >> 3 & 1);
              bVar7 = (bool)(bVar38 >> 4 & 1);
              bVar8 = (bool)(bVar38 >> 5 & 1);
              bVar9 = (bool)(bVar38 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar38 & 1) * auVar41._0_4_ | !(bool)(bVar38 & 1) * local_2940;
              *(uint *)(ray + 0x104) = (uint)bVar28 * auVar41._4_4_ | !bVar28 * local_2940;
              *(uint *)(ray + 0x108) = (uint)bVar5 * auVar41._8_4_ | !bVar5 * local_2940;
              *(uint *)(ray + 0x10c) = (uint)bVar6 * auVar41._12_4_ | !bVar6 * local_2940;
              *(uint *)(ray + 0x110) = (uint)bVar7 * auVar41._16_4_ | !bVar7 * local_2940;
              *(uint *)(ray + 0x114) = (uint)bVar8 * auVar41._20_4_ | !bVar8 * local_2940;
              *(uint *)(ray + 0x118) = (uint)bVar9 * auVar41._24_4_ | !bVar9 * local_2940;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar38 >> 7) * auVar41._28_4_ | !(bool)(bVar38 >> 7) * local_2940;
              local_2b40 = vpmovm2d_avx512vl((ulong)bVar38);
              local_2bc0.valid = (int *)local_2b40;
              local_2bc0.geometryUserPtr = local_2b50->userPtr;
              local_2bc0.context = context->user;
              local_2bc0.hit = (RTCHitN *)&local_2a40;
              local_2bc0.N = 8;
              local_2bc0.ray = (RTCRayN *)ray;
              if (local_2b50->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar81 = ZEXT1664(auVar81._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                (*local_2b50->occlusionFilterN)(&local_2bc0);
              }
              if (local_2b40 == (undefined1  [32])0x0) {
                uVar40 = 0;
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar98 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar99 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar100 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar101 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar102 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar103 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar97 = ZEXT3264(auVar41);
              }
              else {
                p_Var4 = context->args->filter;
                if (p_Var4 == (RTCFilterFunctionN)0x0) {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT3264(auVar41);
                }
                else {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT3264(auVar41);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((local_2b50->field_8).field_0x2 & 0x40) != 0)) {
                    auVar81 = ZEXT1664(auVar81._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    (*p_Var4)(&local_2bc0);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar97 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar103 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar102 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar101 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar100 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar99 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar98 = ZEXT3264(auVar41);
                  }
                }
                uVar40 = vptestmd_avx512vl(local_2b40,local_2b40);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar28 = (bool)((byte)uVar40 & 1);
                auVar49._0_4_ =
                     (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * *(int *)(local_2bc0.ray + 0x100)
                ;
                bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar49._4_4_ =
                     (uint)bVar28 * auVar41._4_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 4);
                bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar49._8_4_ =
                     (uint)bVar28 * auVar41._8_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 8);
                bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar49._12_4_ =
                     (uint)bVar28 * auVar41._12_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0xc);
                bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar49._16_4_ =
                     (uint)bVar28 * auVar41._16_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x10);
                bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar49._20_4_ =
                     (uint)bVar28 * auVar41._20_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x14);
                bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar49._24_4_ =
                     (uint)bVar28 * auVar41._24_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x18);
                bVar28 = SUB81(uVar40 >> 7,0);
                auVar49._28_4_ =
                     (uint)bVar28 * auVar41._28_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x1c);
                *(undefined1 (*) [32])(local_2bc0.ray + 0x100) = auVar49;
              }
              bVar38 = (byte)uVar40;
              auVar50._0_4_ =
                   (uint)(bVar38 & 1) * *(int *)local_2b90 |
                   (uint)!(bool)(bVar38 & 1) * local_2b80._0_4_;
              bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
              auVar50._4_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 4) | (uint)!bVar28 * local_2b80._4_4_;
              bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
              auVar50._8_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 8) | (uint)!bVar28 * local_2b80._8_4_;
              bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
              auVar50._12_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0xc) | (uint)!bVar28 * local_2b80._12_4_;
              bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
              auVar50._16_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x10) | (uint)!bVar28 * local_2b80._16_4_;
              bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
              auVar50._20_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x14) | (uint)!bVar28 * local_2b80._20_4_;
              bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
              auVar50._24_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x18) | (uint)!bVar28 * local_2b80._24_4_;
              bVar28 = SUB81(uVar40 >> 7,0);
              auVar50._28_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x1c) | (uint)!bVar28 * local_2b80._28_4_;
              *(undefined1 (*) [32])local_2b90 = auVar50;
            }
            bVar32 = bVar32 & ~bVar38;
          }
        }
      }
      if (bVar32 == 0) {
        bVar32 = 0;
        goto LAB_01d0773b;
      }
      auVar41 = *(undefined1 (*) [32])ray;
      auVar42 = *(undefined1 (*) [32])(ray + 0x20);
      auVar43 = *(undefined1 (*) [32])(ray + 0x40);
      auVar44 = *(undefined1 (*) [32])(ray + 0x80);
      in_ZMM7 = ZEXT3264(auVar44);
      auVar80 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar84 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar63._4_4_ = uStack_265c;
      auVar63._0_4_ = local_2660;
      auVar63._8_4_ = uStack_2658;
      auVar63._12_4_ = uStack_2654;
      auVar63._16_4_ = uStack_2650;
      auVar63._20_4_ = uStack_264c;
      auVar63._24_4_ = uStack_2648;
      auVar63._28_4_ = uStack_2644;
      auVar73 = vsubps_avx(auVar63,auVar41);
      auVar81 = ZEXT3264(auVar73);
      auVar55._4_4_ = uStack_267c;
      auVar55._0_4_ = local_2680;
      auVar55._8_4_ = uStack_2678;
      auVar55._12_4_ = uStack_2674;
      auVar55._16_4_ = uStack_2670;
      auVar55._20_4_ = uStack_266c;
      auVar55._24_4_ = uStack_2668;
      auVar55._28_4_ = uStack_2664;
      auVar75 = vsubps_avx(auVar55,auVar42);
      auVar54._4_4_ = uStack_269c;
      auVar54._0_4_ = local_26a0;
      auVar54._8_4_ = uStack_2698;
      auVar54._12_4_ = uStack_2694;
      auVar54._16_4_ = uStack_2690;
      auVar54._20_4_ = uStack_268c;
      auVar54._24_4_ = uStack_2688;
      auVar54._28_4_ = uStack_2684;
      auVar76 = vsubps_avx(auVar54,auVar43);
      in_ZMM9 = ZEXT3264(auVar76);
      auVar59 = vsubps_avx(local_26c0,auVar41);
      auVar58 = vsubps_avx(local_26e0,auVar42);
      auVar56 = vsubps_avx512vl(local_2700,auVar43);
      auVar41 = vsubps_avx512vl(local_2ac0,auVar41);
      auVar42 = vsubps_avx512vl(local_2ae0,auVar42);
      auVar43 = vsubps_avx512vl(local_2640,auVar43);
      auVar46 = vsubps_avx512vl(auVar41,auVar73);
      auVar47 = vsubps_avx512vl(auVar42,auVar75);
      auVar48 = vsubps_avx512vl(auVar43,auVar76);
      auVar49 = vsubps_avx512vl(auVar73,auVar59);
      auVar50 = vsubps_avx512vl(auVar75,auVar58);
      auVar54 = vsubps_avx512vl(auVar76,auVar56);
      auVar55 = vsubps_avx512vl(auVar59,auVar41);
      auVar57 = vsubps_avx512vl(auVar58,auVar42);
      auVar61 = vsubps_avx512vl(auVar56,auVar43);
      auVar52 = vaddps_avx512vl(auVar41,auVar73);
      auVar53 = vaddps_avx512vl(auVar42,auVar75);
      auVar51 = vaddps_avx512vl(auVar43,auVar76);
      auVar62 = vmulps_avx512vl(auVar53,auVar48);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar47,auVar51);
      auVar51 = vmulps_avx512vl(auVar51,auVar46);
      auVar63 = vfmsub231ps_avx512vl(auVar51,auVar48,auVar52);
      auVar51._4_4_ = auVar47._4_4_ * auVar52._4_4_;
      auVar51._0_4_ = auVar47._0_4_ * auVar52._0_4_;
      auVar51._8_4_ = auVar47._8_4_ * auVar52._8_4_;
      auVar51._12_4_ = auVar47._12_4_ * auVar52._12_4_;
      auVar51._16_4_ = auVar47._16_4_ * auVar52._16_4_;
      auVar51._20_4_ = auVar47._20_4_ * auVar52._20_4_;
      auVar51._24_4_ = auVar47._24_4_ * auVar52._24_4_;
      auVar51._28_4_ = auVar52._28_4_;
      auVar74 = vfmsub231ps_fma(auVar51,auVar46,auVar53);
      fVar88 = auVar84._0_4_;
      auVar77._0_4_ = fVar88 * auVar74._0_4_;
      fVar90 = auVar84._4_4_;
      auVar77._4_4_ = fVar90 * auVar74._4_4_;
      fVar91 = auVar84._8_4_;
      auVar77._8_4_ = fVar91 * auVar74._8_4_;
      fVar92 = auVar84._12_4_;
      auVar77._12_4_ = fVar92 * auVar74._12_4_;
      fVar93 = auVar84._16_4_;
      auVar77._16_4_ = fVar93 * 0.0;
      fVar94 = auVar84._20_4_;
      auVar77._20_4_ = fVar94 * 0.0;
      fVar95 = auVar84._24_4_;
      auVar77._24_4_ = fVar95 * 0.0;
      auVar77._28_4_ = 0;
      auVar51 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar63);
      auVar51 = vfmadd231ps_avx512vl(auVar51,auVar44,auVar62);
      auVar78._0_4_ = auVar59._0_4_ + auVar73._0_4_;
      auVar78._4_4_ = auVar59._4_4_ + auVar73._4_4_;
      auVar78._8_4_ = auVar59._8_4_ + auVar73._8_4_;
      auVar78._12_4_ = auVar59._12_4_ + auVar73._12_4_;
      auVar78._16_4_ = auVar59._16_4_ + auVar73._16_4_;
      auVar78._20_4_ = auVar59._20_4_ + auVar73._20_4_;
      auVar78._24_4_ = auVar59._24_4_ + auVar73._24_4_;
      auVar78._28_4_ = auVar59._28_4_ + auVar73._28_4_;
      auVar52 = vaddps_avx512vl(auVar75,auVar58);
      auVar53 = vaddps_avx512vl(auVar76,auVar56);
      auVar62 = vmulps_avx512vl(auVar52,auVar54);
      auVar62 = vfmsub231ps_avx512vl(auVar62,auVar50,auVar53);
      auVar53 = vmulps_avx512vl(auVar53,auVar49);
      auVar53 = vfmsub231ps_avx512vl(auVar53,auVar54,auVar78);
      auVar63 = vmulps_avx512vl(auVar78,auVar50);
      auVar63 = vfmsub231ps_avx512vl(auVar63,auVar49,auVar52);
      auVar52._4_4_ = fVar90 * auVar63._4_4_;
      auVar52._0_4_ = fVar88 * auVar63._0_4_;
      auVar52._8_4_ = fVar91 * auVar63._8_4_;
      auVar52._12_4_ = fVar92 * auVar63._12_4_;
      auVar52._16_4_ = fVar93 * auVar63._16_4_;
      auVar52._20_4_ = fVar94 * auVar63._20_4_;
      auVar52._24_4_ = fVar95 * auVar63._24_4_;
      auVar52._28_4_ = auVar63._28_4_;
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar80,auVar53);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar44,auVar62);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar97 = ZEXT3264(auVar62);
      auVar41 = vaddps_avx512vl(auVar59,auVar41);
      auVar42 = vaddps_avx512vl(auVar58,auVar42);
      auVar43 = vaddps_avx512vl(auVar56,auVar43);
      auVar59 = vmulps_avx512vl(auVar42,auVar61);
      auVar59 = vfmsub231ps_avx512vl(auVar59,auVar57,auVar43);
      auVar43 = vmulps_avx512vl(auVar43,auVar55);
      auVar43 = vfmsub231ps_avx512vl(auVar43,auVar61,auVar41);
      auVar53._4_4_ = auVar41._4_4_ * auVar57._4_4_;
      auVar53._0_4_ = auVar41._0_4_ * auVar57._0_4_;
      auVar53._8_4_ = auVar41._8_4_ * auVar57._8_4_;
      auVar53._12_4_ = auVar41._12_4_ * auVar57._12_4_;
      auVar53._16_4_ = auVar41._16_4_ * auVar57._16_4_;
      auVar53._20_4_ = auVar41._20_4_ * auVar57._20_4_;
      auVar53._24_4_ = auVar41._24_4_ * auVar57._24_4_;
      auVar53._28_4_ = auVar41._28_4_;
      auVar74 = vfmsub231ps_fma(auVar53,auVar55,auVar42);
      auVar41 = vmulps_avx512vl(ZEXT1632(auVar74),auVar84);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar80,auVar43);
      auVar41 = vfmadd231ps_avx512vl(auVar41,auVar44,auVar59);
      auVar96._0_4_ = auVar51._0_4_ + auVar52._0_4_;
      auVar96._4_4_ = auVar51._4_4_ + auVar52._4_4_;
      auVar96._8_4_ = auVar51._8_4_ + auVar52._8_4_;
      auVar96._12_4_ = auVar51._12_4_ + auVar52._12_4_;
      auVar96._16_4_ = auVar51._16_4_ + auVar52._16_4_;
      auVar96._20_4_ = auVar51._20_4_ + auVar52._20_4_;
      auVar96._24_4_ = auVar51._24_4_ + auVar52._24_4_;
      auVar96._28_4_ = auVar51._28_4_ + auVar52._28_4_;
      auVar42 = vaddps_avx512vl(auVar41,auVar96);
      auVar56 = auVar98._0_32_;
      vandps_avx512vl(auVar42,auVar56);
      auVar43 = vmulps_avx512vl(auVar42,auVar103._0_32_);
      auVar59 = vminps_avx512vl(auVar51,auVar52);
      auVar59 = vminps_avx512vl(auVar59,auVar41);
      auVar58 = vxorps_avx512vl(auVar43,auVar62);
      uVar13 = vcmpps_avx512vl(auVar59,auVar58,5);
      auVar59 = vmaxps_avx512vl(auVar51,auVar52);
      auVar41 = vmaxps_avx512vl(auVar59,auVar41);
      uVar14 = vcmpps_avx512vl(auVar41,auVar43,2);
      bVar38 = ((byte)uVar13 | (byte)uVar14) & bVar32;
      if (bVar38 != 0) {
        auVar41 = vmulps_avx512vl(auVar50,auVar48);
        auVar43 = vmulps_avx512vl(auVar46,auVar54);
        auVar59 = vmulps_avx512vl(auVar49,auVar47);
        auVar58 = vmulps_avx512vl(auVar57,auVar54);
        auVar53 = vmulps_avx512vl(auVar49,auVar61);
        auVar63 = vmulps_avx512vl(auVar55,auVar50);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar54,auVar41);
        auVar48 = vfmsub213ps_avx512vl(auVar48,auVar49,auVar43);
        auVar46 = vfmsub213ps_avx512vl(auVar46,auVar50,auVar59);
        auVar50 = vfmsub213ps_avx512vl(auVar61,auVar50,auVar58);
        auVar54 = vfmsub213ps_avx512vl(auVar55,auVar54,auVar53);
        auVar49 = vfmsub213ps_avx512vl(auVar57,auVar49,auVar63);
        vandps_avx512vl(auVar41,auVar56);
        vandps_avx512vl(auVar58,auVar56);
        uVar40 = vcmpps_avx512vl(auVar49,auVar49,1);
        vandps_avx512vl(auVar43,auVar56);
        vandps_avx512vl(auVar53,auVar56);
        uVar16 = vcmpps_avx512vl(auVar49,auVar49,1);
        vandps_avx512vl(auVar59,auVar56);
        vandps_avx512vl(auVar63,auVar56);
        uVar12 = vcmpps_avx512vl(auVar49,auVar49,1);
        bVar28 = (bool)((byte)uVar40 & 1);
        local_2a40._0_4_ = (uint)bVar28 * auVar47._0_4_ | (uint)!bVar28 * auVar50._0_4_;
        bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
        local_2a40._4_4_ = (uint)bVar28 * auVar47._4_4_ | (uint)!bVar28 * auVar50._4_4_;
        bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
        local_2a40._8_4_ = (uint)bVar28 * auVar47._8_4_ | (uint)!bVar28 * auVar50._8_4_;
        bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
        local_2a40._12_4_ = (uint)bVar28 * auVar47._12_4_ | (uint)!bVar28 * auVar50._12_4_;
        bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
        local_2a40._16_4_ = (uint)bVar28 * auVar47._16_4_ | (uint)!bVar28 * auVar50._16_4_;
        bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
        local_2a40._20_4_ = (uint)bVar28 * auVar47._20_4_ | (uint)!bVar28 * auVar50._20_4_;
        bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
        local_2a40._24_4_ = (uint)bVar28 * auVar47._24_4_ | (uint)!bVar28 * auVar50._24_4_;
        bVar28 = SUB81(uVar40 >> 7,0);
        local_2a40._28_4_ = (uint)bVar28 * auVar47._28_4_ | (uint)!bVar28 * auVar50._28_4_;
        bVar28 = (bool)((byte)uVar16 & 1);
        vVar64.field_0._0_4_ = (uint)bVar28 * auVar48._0_4_ | (uint)!bVar28 * auVar54._0_4_;
        bVar28 = (bool)((byte)(uVar16 >> 1) & 1);
        vVar64.field_0._4_4_ = (uint)bVar28 * auVar48._4_4_ | (uint)!bVar28 * auVar54._4_4_;
        bVar28 = (bool)((byte)(uVar16 >> 2) & 1);
        vVar64.field_0._8_4_ = (uint)bVar28 * auVar48._8_4_ | (uint)!bVar28 * auVar54._8_4_;
        bVar28 = (bool)((byte)(uVar16 >> 3) & 1);
        vVar64.field_0._12_4_ = (uint)bVar28 * auVar48._12_4_ | (uint)!bVar28 * auVar54._12_4_;
        bVar28 = (bool)((byte)(uVar16 >> 4) & 1);
        vVar64.field_0._16_4_ = (uint)bVar28 * auVar48._16_4_ | (uint)!bVar28 * auVar54._16_4_;
        bVar28 = (bool)((byte)(uVar16 >> 5) & 1);
        vVar64.field_0._20_4_ = (uint)bVar28 * auVar48._20_4_ | (uint)!bVar28 * auVar54._20_4_;
        bVar28 = (bool)((byte)(uVar16 >> 6) & 1);
        vVar64.field_0._24_4_ = (uint)bVar28 * auVar48._24_4_ | (uint)!bVar28 * auVar54._24_4_;
        bVar28 = SUB81(uVar16 >> 7,0);
        vVar64.field_0._28_4_ = (uint)bVar28 * auVar48._28_4_ | (uint)!bVar28 * auVar54._28_4_;
        bVar28 = (bool)((byte)uVar12 & 1);
        local_2a40._64_4_ = (float)((uint)bVar28 * auVar46._0_4_ | (uint)!bVar28 * auVar49._0_4_);
        bVar28 = (bool)((byte)(uVar12 >> 1) & 1);
        local_2a40._68_4_ = (float)((uint)bVar28 * auVar46._4_4_ | (uint)!bVar28 * auVar49._4_4_);
        bVar28 = (bool)((byte)(uVar12 >> 2) & 1);
        local_2a40._72_4_ = (float)((uint)bVar28 * auVar46._8_4_ | (uint)!bVar28 * auVar49._8_4_);
        bVar28 = (bool)((byte)(uVar12 >> 3) & 1);
        local_2a40._76_4_ = (float)((uint)bVar28 * auVar46._12_4_ | (uint)!bVar28 * auVar49._12_4_);
        bVar28 = (bool)((byte)(uVar12 >> 4) & 1);
        local_2a40._80_4_ = (float)((uint)bVar28 * auVar46._16_4_ | (uint)!bVar28 * auVar49._16_4_);
        bVar28 = (bool)((byte)(uVar12 >> 5) & 1);
        local_2a40._84_4_ = (float)((uint)bVar28 * auVar46._20_4_ | (uint)!bVar28 * auVar49._20_4_);
        bVar28 = (bool)((byte)(uVar12 >> 6) & 1);
        local_2a40._88_4_ = (float)((uint)bVar28 * auVar46._24_4_ | (uint)!bVar28 * auVar49._24_4_);
        bVar28 = SUB81(uVar12 >> 7,0);
        local_2a40._92_4_ = (uint)bVar28 * auVar46._28_4_ | (uint)!bVar28 * auVar49._28_4_;
        auVar22._4_4_ = fVar90 * local_2a40._68_4_;
        auVar22._0_4_ = fVar88 * local_2a40._64_4_;
        auVar22._8_4_ = fVar91 * local_2a40._72_4_;
        auVar22._12_4_ = fVar92 * local_2a40._76_4_;
        auVar22._16_4_ = fVar93 * local_2a40._80_4_;
        auVar22._20_4_ = fVar94 * local_2a40._84_4_;
        auVar22._24_4_ = fVar95 * local_2a40._88_4_;
        auVar22._28_4_ = auVar84._28_4_;
        auVar74 = vfmadd213ps_fma(auVar80,(undefined1  [32])vVar64.field_0,auVar22);
        auVar74 = vfmadd213ps_fma(auVar44,(undefined1  [32])local_2a40.field_0.x.field_0,
                                  ZEXT1632(auVar74));
        auVar83._0_4_ = auVar74._0_4_ + auVar74._0_4_;
        auVar83._4_4_ = auVar74._4_4_ + auVar74._4_4_;
        auVar83._8_4_ = auVar74._8_4_ + auVar74._8_4_;
        auVar83._12_4_ = auVar74._12_4_ + auVar74._12_4_;
        auVar80 = ZEXT1632(auVar83);
        in_ZMM7 = ZEXT3264(auVar80);
        auVar86._0_4_ = auVar76._0_4_ * local_2a40._64_4_;
        auVar86._4_4_ = auVar76._4_4_ * local_2a40._68_4_;
        auVar86._8_4_ = auVar76._8_4_ * local_2a40._72_4_;
        auVar86._12_4_ = auVar76._12_4_ * local_2a40._76_4_;
        auVar86._16_4_ = auVar76._16_4_ * local_2a40._80_4_;
        auVar86._20_4_ = auVar76._20_4_ * local_2a40._84_4_;
        auVar86._24_4_ = auVar76._24_4_ * local_2a40._88_4_;
        auVar86._28_4_ = 0;
        auVar74 = vfmadd213ps_fma(auVar75,(undefined1  [32])vVar64.field_0,auVar86);
        auVar17 = vfmadd213ps_fma(auVar73,(undefined1  [32])local_2a40.field_0.x.field_0,
                                  ZEXT1632(auVar74));
        auVar41 = vrcp14ps_avx512vl(auVar80);
        auVar43 = vxorps_avx512vl(auVar80,auVar62);
        auVar84 = auVar99._0_32_;
        auVar44 = vfnmadd213ps_avx512vl(auVar41,auVar80,auVar84);
        auVar74 = vfmadd132ps_fma(auVar44,auVar41,auVar41);
        in_ZMM9 = ZEXT1664(auVar74);
        auVar79._0_4_ = auVar74._0_4_ * (auVar17._0_4_ + auVar17._0_4_);
        auVar79._4_4_ = auVar74._4_4_ * (auVar17._4_4_ + auVar17._4_4_);
        auVar79._8_4_ = auVar74._8_4_ * (auVar17._8_4_ + auVar17._8_4_);
        auVar79._12_4_ = auVar74._12_4_ * (auVar17._12_4_ + auVar17._12_4_);
        local_29e0 = ZEXT1632(auVar79);
        auVar81 = ZEXT3264(local_29e0);
        uVar13 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x100),2);
        uVar14 = vcmpps_avx512vl(local_29e0,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar15 = vcmpps_avx512vl(auVar80,auVar43,4);
        bVar38 = bVar38 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
        if (bVar38 != 0) {
          uVar40 = CONCAT44(0,*(uint *)(local_2bc8 + lVar37 * 4));
          pGVar2 = (context->scene->geometries).items[uVar40].ptr;
          uVar1 = pGVar2->mask;
          auVar82._4_4_ = uVar1;
          auVar82._0_4_ = uVar1;
          auVar82._8_4_ = uVar1;
          auVar82._12_4_ = uVar1;
          auVar82._16_4_ = uVar1;
          auVar82._20_4_ = uVar1;
          auVar82._24_4_ = uVar1;
          auVar82._28_4_ = uVar1;
          uVar13 = vptestmd_avx512vl(auVar82,*(undefined1 (*) [32])(ray + 0x120));
          bVar38 = bVar38 & (byte)uVar13;
          if (bVar38 != 0) {
            local_2b80._0_8_ = uVar40;
            local_2ac0._0_4_ = *(undefined4 *)((long)&local_2af0 + lVar37 * 4);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar18._8_4_ = 0x219392ef;
              auVar18._0_8_ = 0x219392ef219392ef;
              auVar18._12_4_ = 0x219392ef;
              auVar18._16_4_ = 0x219392ef;
              auVar18._20_4_ = 0x219392ef;
              auVar18._24_4_ = 0x219392ef;
              auVar18._28_4_ = 0x219392ef;
              uVar40 = vcmpps_avx512vl(auVar42,auVar18,5);
              auVar41 = vrcp14ps_avx512vl(auVar42);
              auVar42 = vfnmadd213ps_avx512vl(auVar42,auVar41,auVar84);
              auVar41 = vfmadd132ps_avx512vl(auVar42,auVar41,auVar41);
              fVar92 = (float)((uint)((byte)uVar40 & 1) * auVar41._0_4_);
              fVar91 = (float)((uint)((byte)(uVar40 >> 1) & 1) * auVar41._4_4_);
              fVar90 = (float)((uint)((byte)(uVar40 >> 2) & 1) * auVar41._8_4_);
              fVar88 = (float)((uint)((byte)(uVar40 >> 3) & 1) * auVar41._12_4_);
              fVar93 = (float)((uint)((byte)(uVar40 >> 4) & 1) * auVar41._16_4_);
              fVar94 = (float)((uint)((byte)(uVar40 >> 5) & 1) * auVar41._20_4_);
              fVar95 = (float)((uint)((byte)(uVar40 >> 6) & 1) * auVar41._24_4_);
              auVar23._4_4_ = fVar91 * auVar51._4_4_;
              auVar23._0_4_ = fVar92 * auVar51._0_4_;
              auVar23._8_4_ = fVar90 * auVar51._8_4_;
              auVar23._12_4_ = fVar88 * auVar51._12_4_;
              auVar23._16_4_ = fVar93 * auVar51._16_4_;
              auVar23._20_4_ = fVar94 * auVar51._20_4_;
              auVar23._24_4_ = fVar95 * auVar51._24_4_;
              auVar23._28_4_ = auVar51._28_4_;
              auVar41 = vminps_avx512vl(auVar23,auVar84);
              auVar24._4_4_ = fVar91 * auVar52._4_4_;
              auVar24._0_4_ = fVar92 * auVar52._0_4_;
              auVar24._8_4_ = fVar90 * auVar52._8_4_;
              auVar24._12_4_ = fVar88 * auVar52._12_4_;
              auVar24._16_4_ = fVar93 * auVar52._16_4_;
              auVar24._20_4_ = fVar94 * auVar52._20_4_;
              auVar24._24_4_ = fVar95 * auVar52._24_4_;
              auVar24._28_4_ = auVar52._28_4_;
              auVar42 = vminps_avx512vl(auVar24,auVar84);
              local_29a0 = vsubps_avx512vl(auVar84,auVar41);
              local_29c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                           vsubps_avx512vl(auVar84,auVar42);
              local_2bc0.valid = local_2920;
              local_2bc0.geometryUserPtr = &local_2aa0;
              local_2bc0.context = (RTCRayQueryContext *)&local_2a80;
              local_2bc0.ray = local_2a60;
              local_2ae0._0_8_ = pGVar2;
              auVar81 = ZEXT1664(auVar79);
              in_ZMM7 = ZEXT1664(auVar83);
              in_ZMM9 = ZEXT1664(auVar74);
              local_2a40.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar64.field_0;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_2bc0,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_2a40.field_0);
              pRVar3 = context->user;
              local_2980 = vpbroadcastd_avx512vl();
              local_29a0 = vpbroadcastd_avx512vl();
              local_2a40.field_0.y.field_0 = (vfloat_impl<8>)(vfloat_impl<8>)local_2900;
              local_29c0 = local_2a80;
              auVar41 = vpcmpeqd_avx2(local_2980,local_2980);
              local_2b48[1] = auVar41;
              *local_2b48 = auVar41;
              local_2960 = pRVar3->instID[0];
              uStack_295c = local_2960;
              uStack_2958 = local_2960;
              uStack_2954 = local_2960;
              uStack_2950 = local_2960;
              uStack_294c = local_2960;
              uStack_2948 = local_2960;
              uStack_2944 = local_2960;
              local_2940 = pRVar3->instPrimID[0];
              uStack_293c = local_2940;
              uStack_2938 = local_2940;
              uStack_2934 = local_2940;
              uStack_2930 = local_2940;
              uStack_292c = local_2940;
              uStack_2928 = local_2940;
              uStack_2924 = local_2940;
              local_2b80 = *(undefined1 (*) [32])(ray + 0x100);
              auVar41 = vblendmps_avx512vl(local_2b80,(undefined1  [32])local_2aa0);
              bVar28 = (bool)(bVar38 >> 1 & 1);
              bVar5 = (bool)(bVar38 >> 2 & 1);
              bVar6 = (bool)(bVar38 >> 3 & 1);
              bVar7 = (bool)(bVar38 >> 4 & 1);
              bVar8 = (bool)(bVar38 >> 5 & 1);
              bVar9 = (bool)(bVar38 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar38 & 1) * auVar41._0_4_ | !(bool)(bVar38 & 1) * local_2940;
              *(uint *)(ray + 0x104) = (uint)bVar28 * auVar41._4_4_ | !bVar28 * local_2940;
              *(uint *)(ray + 0x108) = (uint)bVar5 * auVar41._8_4_ | !bVar5 * local_2940;
              *(uint *)(ray + 0x10c) = (uint)bVar6 * auVar41._12_4_ | !bVar6 * local_2940;
              *(uint *)(ray + 0x110) = (uint)bVar7 * auVar41._16_4_ | !bVar7 * local_2940;
              *(uint *)(ray + 0x114) = (uint)bVar8 * auVar41._20_4_ | !bVar8 * local_2940;
              *(uint *)(ray + 0x118) = (uint)bVar9 * auVar41._24_4_ | !bVar9 * local_2940;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar38 >> 7) * auVar41._28_4_ | !(bool)(bVar38 >> 7) * local_2940;
              local_2b40 = vpmovm2d_avx512vl((ulong)bVar38);
              local_2bc0.valid = (int *)local_2b40;
              local_2bc0.geometryUserPtr = *(void **)(local_2ae0._0_8_ + 0x18);
              local_2bc0.context = context->user;
              local_2bc0.hit = (RTCHitN *)&local_2a40;
              local_2bc0.N = 8;
              local_2bc0.ray = (RTCRayN *)ray;
              if (*(code **)(local_2ae0._0_8_ + 0x48) != (code *)0x0) {
                auVar81 = ZEXT1664(auVar81._0_16_);
                in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                (**(code **)(local_2ae0._0_8_ + 0x48))(&local_2bc0);
              }
              if (local_2b40 == (undefined1  [32])0x0) {
                uVar40 = 0;
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar98 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar99 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar100 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar101 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar102 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar103 = ZEXT3264(auVar41);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar97 = ZEXT3264(auVar41);
              }
              else {
                p_Var4 = context->args->filter;
                if (p_Var4 == (RTCFilterFunctionN)0x0) {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT3264(auVar41);
                }
                else {
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar98 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar99 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar100 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar101 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar102 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar103 = ZEXT3264(auVar41);
                  auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar97 = ZEXT3264(auVar41);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     ((*(byte *)(local_2ae0._0_8_ + 0x3e) & 0x40) != 0)) {
                    auVar81 = ZEXT1664(auVar81._0_16_);
                    in_ZMM7 = ZEXT1664(in_ZMM7._0_16_);
                    in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                    (*p_Var4)(&local_2bc0);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar97 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                    auVar103 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar102 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar101 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar100 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar99 = ZEXT3264(auVar41);
                    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar98 = ZEXT3264(auVar41);
                  }
                }
                uVar40 = vptestmd_avx512vl(local_2b40,local_2b40);
                auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar28 = (bool)((byte)uVar40 & 1);
                auVar65._0_4_ =
                     (uint)bVar28 * auVar41._0_4_ | (uint)!bVar28 * *(int *)(local_2bc0.ray + 0x100)
                ;
                bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
                auVar65._4_4_ =
                     (uint)bVar28 * auVar41._4_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 4);
                bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
                auVar65._8_4_ =
                     (uint)bVar28 * auVar41._8_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 8);
                bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
                auVar65._12_4_ =
                     (uint)bVar28 * auVar41._12_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0xc);
                bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
                auVar65._16_4_ =
                     (uint)bVar28 * auVar41._16_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x10);
                bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
                auVar65._20_4_ =
                     (uint)bVar28 * auVar41._20_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x14);
                bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
                auVar65._24_4_ =
                     (uint)bVar28 * auVar41._24_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x18);
                bVar28 = SUB81(uVar40 >> 7,0);
                auVar65._28_4_ =
                     (uint)bVar28 * auVar41._28_4_ |
                     (uint)!bVar28 * *(int *)((RayK<8> *)(local_2bc0.ray + 0x100) + 0x1c);
                *(undefined1 (*) [32])(local_2bc0.ray + 0x100) = auVar65;
              }
              bVar38 = (byte)uVar40;
              auVar66._0_4_ =
                   (uint)(bVar38 & 1) * *(int *)local_2b90 |
                   (uint)!(bool)(bVar38 & 1) * local_2b80._0_4_;
              bVar28 = (bool)((byte)(uVar40 >> 1) & 1);
              auVar66._4_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 4) | (uint)!bVar28 * local_2b80._4_4_;
              bVar28 = (bool)((byte)(uVar40 >> 2) & 1);
              auVar66._8_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 8) | (uint)!bVar28 * local_2b80._8_4_;
              bVar28 = (bool)((byte)(uVar40 >> 3) & 1);
              auVar66._12_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0xc) | (uint)!bVar28 * local_2b80._12_4_;
              bVar28 = (bool)((byte)(uVar40 >> 4) & 1);
              auVar66._16_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x10) | (uint)!bVar28 * local_2b80._16_4_;
              bVar28 = (bool)((byte)(uVar40 >> 5) & 1);
              auVar66._20_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x14) | (uint)!bVar28 * local_2b80._20_4_;
              bVar28 = (bool)((byte)(uVar40 >> 6) & 1);
              auVar66._24_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x18) | (uint)!bVar28 * local_2b80._24_4_;
              bVar28 = SUB81(uVar40 >> 7,0);
              auVar66._28_4_ =
                   (uint)bVar28 * *(int *)(local_2b90 + 0x1c) | (uint)!bVar28 * local_2b80._28_4_;
              *(undefined1 (*) [32])local_2b90 = auVar66;
            }
            bVar32 = bVar32 & ~bVar38;
          }
        }
      }
      lVar37 = lVar37 + 1;
    } while (bVar32 != 0);
    bVar32 = 0;
LAB_01d0773b:
    lVar30 = local_2b00 + 1;
    local_2bc8 = local_2bc8 + 0xe0;
    bVar34 = bVar34 & bVar32;
  } while (bVar34 != 0);
  bVar34 = 0;
LAB_01d07757:
  bVar34 = (byte)local_2bf0 | ~bVar34;
  local_2bf0 = (uint)bVar34;
  if (bVar34 == 0xff) {
    local_2bf0._0_1_ = 0xff;
    goto LAB_01d078af;
  }
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar28 = (bool)(bVar34 >> 1 & 1);
  bVar5 = (bool)(bVar34 >> 2 & 1);
  bVar6 = (bool)(bVar34 >> 3 & 1);
  bVar7 = (bool)(bVar34 >> 4 & 1);
  bVar8 = (bool)(bVar34 >> 5 & 1);
  bVar9 = (bool)(bVar34 >> 6 & 1);
  local_2720._4_4_ = (uint)bVar28 * auVar41._4_4_ | (uint)!bVar28 * local_2720._4_4_;
  local_2720._0_4_ =
       (uint)(bVar34 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar34 & 1) * local_2720._0_4_;
  local_2720._8_4_ = (uint)bVar5 * auVar41._8_4_ | (uint)!bVar5 * local_2720._8_4_;
  local_2720._12_4_ = (uint)bVar6 * auVar41._12_4_ | (uint)!bVar6 * local_2720._12_4_;
  local_2720._16_4_ = (uint)bVar7 * auVar41._16_4_ | (uint)!bVar7 * local_2720._16_4_;
  local_2720._20_4_ = (uint)bVar8 * auVar41._20_4_ | (uint)!bVar8 * local_2720._20_4_;
  local_2720._24_4_ = (uint)bVar9 * auVar41._24_4_ | (uint)!bVar9 * local_2720._24_4_;
  local_2720._28_4_ =
       (uint)(bVar34 >> 7) * auVar41._28_4_ | (uint)!(bool)(bVar34 >> 7) * local_2720._28_4_;
  goto LAB_01d064fd;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }